

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
::isSimple(BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
           *this)

{
  CoordinateOrder CVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *this_00;
  View<float,_false,_std::allocator<unsigned_long>_> *this_01;
  bool bVar2;
  
  bVar2 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(this->e1_);
  if ((bVar2) &&
     (bVar2 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(this->e2_), bVar2)) {
    this_00 = this->e1_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(this_00);
    CVar1 = (this_00->geometry_).coordinateOrder_;
    this_01 = this->e2_;
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(this_01);
    return CVar1 == (this_01->geometry_).coordinateOrder_;
  }
  return false;
}

Assistant:

const bool isSimple() const
        { return e1_.isSimple() && e2_.isSimple() 
                 && e1_.coordinateOrder() == e2_.coordinateOrder(); }